

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

ssize_t __thiscall
capnp::
Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
::send(Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
       *this,int __fd,void *__buf,size_t __n,int __flags)

{
  RequestHook *pRVar1;
  Type *func;
  Pipeline *pPVar2;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_> *promise;
  Pipeline *pipeline;
  undefined4 in_register_00000034;
  Own<capnp::RequestHook> *this_00;
  undefined1 local_a0 [8];
  Pipeline typedPipeline;
  undefined1 local_70 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_h:769:13),_capnp::Response<capnp::AnyPointer>_>
  typedPromise;
  undefined1 local_50 [8];
  RemotePromise<capnp::AnyPointer> typelessPromise;
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  *this_local;
  
  typelessPromise.super_Pipeline.ops.disposer = (ArrayDisposer *)CONCAT44(in_register_00000034,__fd)
  ;
  this_00 = (Own<capnp::RequestHook> *)(typelessPromise.super_Pipeline.ops.disposer + 5);
  pRVar1 = kj::Own<capnp::RequestHook>::operator->(this_00);
  (**pRVar1->_vptr_RequestHook)(local_50);
  kj::Own<capnp::RequestHook>::operator=(this_00,(void *)0x0);
  func = (Type *)kj::
                 implicitCast<kj::Promise<capnp::Response<capnp::AnyPointer>>&,capnp::RemotePromise<capnp::AnyPointer>&>
                           ((RemotePromise<capnp::AnyPointer> *)local_50);
  kj::Promise<capnp::Response<capnp::AnyPointer>>::
  then<capnp::Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,capnproto_test::capnp::test::TestMembrane::LoopbackResults>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
            ((Promise<capnp::Response<capnp::AnyPointer>> *)local_70,func,
             (PropagateException *)((long)&typedPipeline._typeless.ops.disposer + 7));
  pPVar2 = kj::implicitCast<capnp::AnyPointer::Pipeline&,capnp::RemotePromise<capnp::AnyPointer>&>
                     ((RemotePromise<capnp::AnyPointer> *)local_50);
  pPVar2 = kj::mv<capnp::AnyPointer::Pipeline>(pPVar2);
  capnproto_test::capnp::test::TestMembrane::LoopbackResults::Pipeline::Pipeline
            ((Pipeline *)local_a0,pPVar2);
  promise = kj::
            mv<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>>>
                      ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
                        *)local_70);
  pipeline = kj::mv<capnproto_test::capnp::test::TestMembrane::LoopbackResults::Pipeline>
                       ((Pipeline *)local_a0);
  RemotePromise<capnproto_test::capnp::test::TestMembrane::LoopbackResults>::RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMembrane::LoopbackResults> *)this,
             promise,pipeline);
  capnproto_test::capnp::test::TestMembrane::LoopbackResults::Pipeline::~Pipeline
            ((Pipeline *)local_a0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>::
  ~Promise((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_> *)
           local_70);
  RemotePromise<capnp::AnyPointer>::~RemotePromise((RemotePromise<capnp::AnyPointer> *)local_50);
  return (ssize_t)this;
}

Assistant:

RemotePromise<Results> Request<Params, Results>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([](Response<AnyPointer>&& response) -> Response<Results> {
        return Response<Results>(response.getAs<Results>(), kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  typename Results::Pipeline typedPipeline(
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<Results>(kj::mv(typedPromise), kj::mv(typedPipeline));
}